

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_avx2.c
# Opt level: O2

void av1_calc_indices_dim1_avx2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  long lVar1;
  int16_t iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  int j;
  int iVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  __m256i cents [8];
  undefined1 local_140 [32];
  undefined1 local_120 [272];
  
  lVar8 = 0;
  uVar10 = 0;
  if (0 < k) {
    uVar10 = (ulong)(uint)k;
  }
  for (; uVar10 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
    iVar2 = *centroids;
    lVar1 = lVar8 * 2;
    *(int16_t *)(local_140 + lVar1) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 2) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 4) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 6) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 8) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 10) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 0xc) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 0xe) = iVar2;
    *(int16_t *)(local_140 + lVar1 + 0x10) = iVar2;
    *(int16_t *)(local_120 + lVar1 + -0xe) = iVar2;
    *(int16_t *)(local_120 + lVar1 + -0xc) = iVar2;
    *(int16_t *)(local_120 + lVar1 + -10) = iVar2;
    *(int16_t *)(local_120 + lVar1 + -8) = iVar2;
    *(int16_t *)(local_120 + lVar1 + -6) = iVar2;
    *(int16_t *)(local_120 + lVar1 + -4) = iVar2;
    *(int16_t *)(local_120 + lVar1 + -2) = iVar2;
    centroids = centroids + 1;
  }
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  for (iVar9 = 0; iVar9 < n; iVar9 = iVar9 + 0x10) {
    auVar7 = vpsubw_avx2(*(undefined1 (*) [32])data,local_140);
    auVar7 = vpabsw_avx2(auVar7);
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    pauVar11 = (undefined1 (*) [32])local_120;
    for (lVar8 = 1; lVar8 < k; lVar8 = lVar8 + 1) {
      auVar14 = vpsubw_avx2(*(undefined1 (*) [32])data,*pauVar11);
      auVar14 = vpabsw_avx2(auVar14);
      auVar6 = vpcmpgtw_avx2(auVar7,auVar14);
      auVar7 = vpminsw_avx2(auVar7,auVar14);
      auVar14._0_2_ = (undefined2)lVar8;
      auVar14._2_2_ = auVar14._0_2_;
      auVar14._4_2_ = auVar14._0_2_;
      auVar14._6_2_ = auVar14._0_2_;
      auVar14._8_2_ = auVar14._0_2_;
      auVar14._10_2_ = auVar14._0_2_;
      auVar14._12_2_ = auVar14._0_2_;
      auVar14._14_2_ = auVar14._0_2_;
      auVar14._16_2_ = auVar14._0_2_;
      auVar14._18_2_ = auVar14._0_2_;
      auVar14._20_2_ = auVar14._0_2_;
      auVar14._22_2_ = auVar14._0_2_;
      auVar14._24_2_ = auVar14._0_2_;
      auVar14._26_2_ = auVar14._0_2_;
      auVar14._28_2_ = auVar14._0_2_;
      auVar14._30_2_ = auVar14._0_2_;
      auVar5 = vpandn_avx2(auVar6,auVar13._0_32_);
      auVar14 = vpand_avx2(auVar6,auVar14);
      auVar14 = vpor_avx2(auVar5,auVar14);
      auVar13 = ZEXT3264(auVar14);
      pauVar11 = pauVar11 + 1;
    }
    auVar3 = vpackuswb_avx(auVar13._0_16_,auVar13._16_16_);
    *(undefined1 (*) [16])indices = auVar3;
    if (total_dist != (int64_t *)0x0) {
      auVar7 = vpmaddwd_avx2(auVar7,auVar7);
      auVar5 = vpunpckldq_avx2(auVar7,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar14 = vpunpckhdq_avx2(auVar7,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar7 = vpaddq_avx2(auVar12._0_32_,auVar5);
      auVar7 = vpaddq_avx2(auVar7,auVar14);
      auVar12 = ZEXT3264(auVar7);
    }
    indices = (uint8_t *)((long)indices + 0x10);
    data = (int16_t *)((long)data + 0x20);
  }
  if (total_dist != (int64_t *)0x0) {
    auVar3 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar4,auVar3);
    *total_dist = auVar3._0_8_;
  }
  return;
}

Assistant:

void av1_calc_indices_dim1_avx2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m256i v_zero = _mm256_setzero_si256();
  __m256i sum = _mm256_setzero_si256();
  __m256i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    cents[j] = _mm256_set1_epi16(centroids[j]);
  }

  for (int i = 0; i < n; i += 16) {
    const __m256i in = _mm256_loadu_si256((__m256i *)data);
    __m256i ind = _mm256_setzero_si256();
    // Compute the distance to the first centroid.
    __m256i d1 = _mm256_sub_epi16(in, cents[0]);
    __m256i dist_min = _mm256_abs_epi16(d1);

    for (int j = 1; j < k; ++j) {
      // Compute the distance to the centroid.
      d1 = _mm256_sub_epi16(in, cents[j]);
      const __m256i dist = _mm256_abs_epi16(d1);
      // Compare to the minimal one.
      const __m256i cmp = _mm256_cmpgt_epi16(dist_min, dist);
      dist_min = _mm256_min_epi16(dist_min, dist);
      const __m256i ind1 = _mm256_set1_epi16(j);
      ind = _mm256_or_si256(_mm256_andnot_si256(cmp, ind),
                            _mm256_and_si256(cmp, ind1));
    }

    const __m256i p1 = _mm256_packus_epi16(ind, v_zero);
    const __m256i px = _mm256_permute4x64_epi64(p1, 0x58);
    const __m128i d2 = _mm256_extracti128_si256(px, 0);

    _mm_storeu_si128((__m128i *)indices, d2);

    if (total_dist) {
      // Square, convert to 32 bit and add together.
      dist_min = _mm256_madd_epi16(dist_min, dist_min);
      // Convert to 64 bit and add to sum.
      const __m256i dist1 = _mm256_unpacklo_epi32(dist_min, v_zero);
      const __m256i dist2 = _mm256_unpackhi_epi32(dist_min, v_zero);
      sum = _mm256_add_epi64(sum, dist1);
      sum = _mm256_add_epi64(sum, dist2);
    }

    indices += 16;
    data += 16;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_avx2(sum);
  }
}